

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::SetSwapLimit(StandardBufferManager *this,optional_idx limit)

{
  mutex *__mutex;
  pointer pTVar1;
  type this_00;
  
  __mutex = &(this->temporary_directory).lock;
  ::std::mutex::lock(__mutex);
  if ((this->temporary_directory).handle.
      super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl ==
      (TemporaryDirectoryHandle *)0x0) {
    (this->temporary_directory).maximum_swap_space.index = limit.index;
  }
  else {
    pTVar1 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
             ::operator->(&(this->temporary_directory).handle);
    this_00 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
              ::operator*(&pTVar1->temp_file);
    TemporaryFileManager::SetMaxSwapSpace(this_00,limit);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void StandardBufferManager::SetSwapLimit(optional_idx limit) {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (temporary_directory.handle) {
		temporary_directory.handle->GetTempFile().SetMaxSwapSpace(limit);
	} else {
		temporary_directory.maximum_swap_space = limit;
	}
}